

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  long *plVar1;
  Reflection *input_00;
  CodedInputStream *pCVar2;
  Message *pMVar3;
  uint32 tag_00;
  bool bVar4;
  int iVar5;
  WireType WVar6;
  WireType WVar7;
  Type TVar8;
  Syntax SVar9;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar10;
  Descriptor *pDVar11;
  FileDescriptor *pFVar12;
  EnumDescriptor *pEVar13;
  EnumValueDescriptor *pEVar14;
  char *pcVar15;
  char *pcVar16;
  MessageFactory *pMVar17;
  MessageLite *local_190;
  Message *sub_message_1;
  Message *sub_message;
  string value_29;
  undefined1 local_150 [8];
  string value_28;
  bool strict_utf8_check;
  int64 sign_extended_value_1;
  EnumValueDescriptor *enum_value_1;
  int value_27;
  bool value_26;
  double value_25;
  int64 iStack_100;
  float value_24;
  int64 value_23;
  uint64 uStack_f0;
  int32 value_22;
  uint64 value_21;
  uint64 uStack_e0;
  uint32 value_20;
  uint64 value_19;
  int64 iStack_d0;
  uint32 value_18;
  int64 value_17;
  int64 iStack_c0;
  int32 value_16;
  int64 value_15;
  uint64 uStack_b0;
  int32 value_14;
  int64 sign_extended_value;
  EnumValueDescriptor *enum_value;
  int value_13;
  bool value_12;
  double value_11;
  int64 iStack_88;
  float value_10;
  int64 value_9;
  uint64 uStack_78;
  int32 value_8;
  uint64 value_7;
  uint64 uStack_68;
  uint32 value_6;
  uint64 value_5;
  int64 iStack_58;
  uint32 value_4;
  int64 value_3;
  int64 iStack_48;
  int32 value_2;
  int64 value_1;
  int32 value;
  Limit limit;
  uint32 length;
  anon_enum_32 value_format;
  Reflection *message_reflection;
  CodedInputStream *input_local;
  Message *message_local;
  FieldDescriptor *field_local;
  uint32 tag_local;
  
  message_reflection = (Reflection *)input;
  input_local = (CodedInputStream *)message;
  message_local = (Message *)field;
  field_local._0_4_ = tag;
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  _length = (long *)CONCAT44(extraout_var,iVar5);
  if (message_local == (Message *)0x0) {
    limit = 0;
  }
  else {
    WVar6 = WireFormatLite::GetTagWireType((uint32)field_local);
    TVar8 = FieldDescriptor::type((FieldDescriptor *)message_local);
    WVar7 = WireTypeForFieldType(TVar8);
    if (WVar6 == WVar7) {
      limit = 1;
    }
    else {
      bVar4 = FieldDescriptor::is_packable((FieldDescriptor *)message_local);
      if ((bVar4) &&
         (WVar6 = WireFormatLite::GetTagWireType((uint32)field_local),
         WVar6 == WIRETYPE_LENGTH_DELIMITED)) {
        limit = 2;
      }
      else {
        limit = 0;
      }
    }
  }
  tag_00 = (uint32)field_local;
  input_00 = message_reflection;
  if (limit == 0) {
    pUVar10 = (UnknownFieldSet *)(**(code **)(*_length + 0x18))(_length,input_local);
    field_local._7_1_ = SkipField((CodedInputStream *)input_00,tag_00,pUVar10);
    goto LAB_005b23af;
  }
  if (limit == 2) {
    bVar4 = io::CodedInputStream::ReadVarint32
                      ((CodedInputStream *)message_reflection,(uint32 *)&value);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    value_1._4_4_ = io::CodedInputStream::PushLimit((CodedInputStream *)message_reflection,value);
    TVar8 = FieldDescriptor::type((FieldDescriptor *)message_local);
    switch(TVar8) {
    case TYPE_DOUBLE:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          ((CodedInputStream *)message_reflection,(double *)&value_13);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x230))(_value_13,_length,input_local,message_local);
      }
      break;
    case TYPE_FLOAT:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          ((CodedInputStream *)message_reflection,(float *)((long)&value_11 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x228))(value_11._4_4_,_length,input_local,message_local);
      }
      break;
    case TYPE_INT64:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffffb8);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x210))(_length,input_local,message_local,iStack_48);
      }
      break;
    case TYPE_UINT64:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffff98);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x220))(_length,input_local,message_local,uStack_68);
      }
      break;
    case TYPE_INT32:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          ((CodedInputStream *)message_reflection,(int32 *)&value_1);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x208))(_length,input_local,message_local,(undefined4)value_1);
      }
      break;
    case TYPE_FIXED64:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)6>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffff88);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x220))(_length,input_local,message_local,uStack_78);
      }
      break;
    case TYPE_FIXED32:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)7>
                          ((CodedInputStream *)message_reflection,(uint32 *)((long)&value_7 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x218))(_length,input_local,message_local,value_7._4_4_);
      }
      break;
    case TYPE_BOOL:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          ((CodedInputStream *)message_reflection,(bool *)((long)&enum_value + 7));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x238))(_length,input_local,message_local,enum_value._7_1_ & 1);
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    case TYPE_UINT32:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          ((CodedInputStream *)message_reflection,(uint32 *)((long)&value_5 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x218))(_length,input_local,message_local,value_5._4_4_);
      }
      break;
    case TYPE_ENUM:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          ((CodedInputStream *)message_reflection,(int *)&enum_value);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        pDVar11 = Message::GetDescriptor((Message *)input_local);
        pFVar12 = Descriptor::file(pDVar11);
        SVar9 = FileDescriptor::syntax(pFVar12);
        if (SVar9 == SYNTAX_PROTO3) {
          (**(code **)(*_length + 0x250))(_length,input_local,message_local,(int)enum_value);
        }
        else {
          pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)message_local);
          sign_extended_value = (int64)EnumDescriptor::FindValueByNumber(pEVar13,(int)enum_value);
          if ((EnumValueDescriptor *)sign_extended_value == (EnumValueDescriptor *)0x0) {
            uStack_b0 = (uint64)(int)enum_value;
            pUVar10 = (UnknownFieldSet *)(**(code **)(*_length + 0x18))(_length,input_local);
            iVar5 = WireFormatLite::GetTagFieldNumber((uint32)field_local);
            UnknownFieldSet::AddVarint(pUVar10,iVar5,uStack_b0);
          }
          else {
            (**(code **)(*_length + 0x248))(_length,input_local,message_local,sign_extended_value);
          }
        }
      }
      break;
    case TYPE_SFIXED32:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                          ((CodedInputStream *)message_reflection,(int32 *)((long)&value_9 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x208))(_length,input_local,message_local,value_9._4_4_);
      }
      break;
    case TYPE_SFIXED64:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffff78);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x210))(_length,input_local,message_local,iStack_88);
      }
      break;
    case TYPE_SINT32:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                          ((CodedInputStream *)message_reflection,(int32 *)((long)&value_3 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x208))(_length,input_local,message_local,value_3._4_4_);
      }
      break;
    case MAX_TYPE:
      while (iVar5 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar5) {
        bVar4 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffffa8);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_005b23af;
        }
        (**(code **)(*_length + 0x210))(_length,input_local,message_local,iStack_58);
      }
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)message_reflection,value_1._4_4_);
    goto LAB_005b23ab;
  }
  TVar8 = FieldDescriptor::type((FieldDescriptor *)message_local);
  switch(TVar8) {
  case TYPE_DOUBLE:
    bVar4 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      ((CodedInputStream *)message_reflection,(double *)&value_27);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x230))(_value_27,_length,input_local,message_local);
    }
    else {
      (**(code **)(*_length + 0x110))(_value_27,_length,input_local,message_local);
    }
    break;
  case TYPE_FLOAT:
    bVar4 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      ((CodedInputStream *)message_reflection,(float *)((long)&value_25 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x228))(value_25._4_4_,_length,input_local,message_local);
    }
    else {
      (**(code **)(*_length + 0x108))(value_25._4_4_,_length,input_local,message_local);
    }
    break;
  case TYPE_INT64:
    bVar4 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff40);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x210))(_length,input_local,message_local,iStack_c0);
    }
    else {
      (**(code **)(*_length + 0xf0))(_length,input_local,message_local,iStack_c0);
    }
    break;
  case TYPE_UINT64:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff20);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x220))(_length,input_local,message_local,uStack_e0);
    }
    else {
      (**(code **)(*_length + 0x100))(_length,input_local,message_local,uStack_e0);
    }
    break;
  case TYPE_INT32:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      ((CodedInputStream *)message_reflection,(int32 *)((long)&value_15 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x208))(_length,input_local,message_local,value_15._4_4_);
    }
    else {
      (**(code **)(*_length + 0xe8))(_length,input_local,message_local,value_15._4_4_);
    }
    break;
  case TYPE_FIXED64:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)6>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff10);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x220))(_length,input_local,message_local,uStack_f0);
    }
    else {
      (**(code **)(*_length + 0x100))(_length,input_local,message_local,uStack_f0);
    }
    break;
  case TYPE_FIXED32:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)7>
                      ((CodedInputStream *)message_reflection,(uint32 *)((long)&value_21 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x218))(_length,input_local,message_local,value_21._4_4_);
    }
    else {
      (**(code **)(*_length + 0xf8))(_length,input_local,message_local,value_21._4_4_);
    }
    break;
  case TYPE_BOOL:
    bVar4 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      ((CodedInputStream *)message_reflection,(bool *)((long)&enum_value_1 + 7));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x238))(_length,input_local,message_local,enum_value_1._7_1_ & 1);
    }
    else {
      (**(code **)(*_length + 0x118))(_length,input_local,message_local,enum_value_1._7_1_ & 1);
    }
    break;
  case TYPE_STRING:
    value_28.field_2._M_local_buf[0xf] = StrictUtf8Check((FieldDescriptor *)message_local);
    std::__cxx11::string::string((string *)local_150);
    bVar4 = WireFormatLite::ReadString((CodedInputStream *)message_reflection,(string *)local_150);
    if (bVar4) {
      if ((value_28.field_2._M_local_buf[0xf] & 1U) == 0) {
        pcVar15 = (char *)std::__cxx11::string::data();
        iVar5 = std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)message_local);
        pcVar16 = (char *)std::__cxx11::string::c_str();
        VerifyUTF8StringNamedField(pcVar15,iVar5,PARSE,pcVar16);
      }
      else {
        pcVar15 = (char *)std::__cxx11::string::data();
        iVar5 = std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)message_local);
        pcVar16 = (char *)std::__cxx11::string::c_str();
        bVar4 = WireFormatLite::VerifyUtf8String(pcVar15,iVar5,PARSE,pcVar16);
        if (!bVar4) {
          field_local._7_1_ = 0;
          value_29.field_2._8_4_ = 1;
          goto LAB_005b20d7;
        }
      }
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
      if (bVar4) {
        (**(code **)(*_length + 0x240))(_length,input_local,message_local,local_150);
      }
      else {
        (**(code **)(*_length + 0x120))(_length,input_local,message_local,local_150);
      }
      value_29.field_2._8_4_ = 0x1f;
    }
    else {
      field_local._7_1_ = 0;
      value_29.field_2._8_4_ = 1;
    }
LAB_005b20d7:
    std::__cxx11::string::~string((string *)local_150);
    goto joined_r0x005b21e8;
  case TYPE_GROUP:
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    pMVar3 = message_local;
    pCVar2 = input_local;
    plVar1 = _length;
    if (bVar4) {
      pMVar17 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      sub_message_1 = (Message *)(**(code **)(*plVar1 + 600))(plVar1,pCVar2,pMVar3,pMVar17);
    }
    else {
      pMVar17 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      sub_message_1 = (Message *)(**(code **)(*plVar1 + 0x138))(plVar1,pCVar2,pMVar3,pMVar17);
    }
    iVar5 = WireFormatLite::GetTagFieldNumber((uint32)field_local);
    bVar4 = WireFormatLite::ReadGroup
                      (iVar5,(CodedInputStream *)message_reflection,
                       &sub_message_1->super_MessageLite);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    break;
  case TYPE_MESSAGE:
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    pMVar3 = message_local;
    pCVar2 = input_local;
    plVar1 = _length;
    if (bVar4) {
      pMVar17 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      local_190 = (MessageLite *)(**(code **)(*plVar1 + 600))(plVar1,pCVar2,pMVar3,pMVar17);
    }
    else {
      pMVar17 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      local_190 = (MessageLite *)(**(code **)(*plVar1 + 0x138))(plVar1,pCVar2,pMVar3,pMVar17);
    }
    bVar4 = WireFormatLite::ReadMessage((CodedInputStream *)message_reflection,local_190);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    break;
  case TYPE_BYTES:
    std::__cxx11::string::string((string *)&sub_message);
    bVar4 = WireFormatLite::ReadBytes((CodedInputStream *)message_reflection,(string *)&sub_message)
    ;
    if (bVar4) {
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
      if (bVar4) {
        (**(code **)(*_length + 0x240))(_length,input_local,message_local,&sub_message);
      }
      else {
        (**(code **)(*_length + 0x120))(_length,input_local,message_local,&sub_message);
      }
      value_29.field_2._8_4_ = 0x1f;
    }
    else {
      field_local._7_1_ = 0;
      value_29.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&sub_message);
joined_r0x005b21e8:
    if (value_29.field_2._8_4_ == 1) goto LAB_005b23af;
    break;
  case TYPE_UINT32:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                      ((CodedInputStream *)message_reflection,(uint32 *)((long)&value_19 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x218))(_length,input_local,message_local,value_19._4_4_);
    }
    else {
      (**(code **)(*_length + 0xf8))(_length,input_local,message_local,value_19._4_4_);
    }
    break;
  case TYPE_ENUM:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      ((CodedInputStream *)message_reflection,(int *)&enum_value_1);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    pDVar11 = Message::GetDescriptor((Message *)input_local);
    pFVar12 = Descriptor::file(pDVar11);
    SVar9 = FileDescriptor::syntax(pFVar12);
    if (SVar9 == SYNTAX_PROTO3) {
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
      if (bVar4) {
        (**(code **)(*_length + 0x250))(_length,input_local,message_local,(int)enum_value_1);
      }
      else {
        (**(code **)(*_length + 0x130))(_length,input_local,message_local,(int)enum_value_1);
      }
    }
    else {
      pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)message_local);
      pEVar14 = EnumDescriptor::FindValueByNumber(pEVar13,(int)enum_value_1);
      if (pEVar14 == (EnumValueDescriptor *)0x0) {
        pUVar10 = (UnknownFieldSet *)(**(code **)(*_length + 0x18))(_length,input_local);
        iVar5 = WireFormatLite::GetTagFieldNumber((uint32)field_local);
        UnknownFieldSet::AddVarint(pUVar10,iVar5,(long)(int)enum_value_1);
      }
      else {
        bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
        if (bVar4) {
          (**(code **)(*_length + 0x248))(_length,input_local,message_local,pEVar14);
        }
        else {
          (**(code **)(*_length + 0x128))(_length,input_local,message_local,pEVar14);
        }
      }
    }
    break;
  case TYPE_SFIXED32:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      ((CodedInputStream *)message_reflection,(int32 *)((long)&value_23 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x208))(_length,input_local,message_local,value_23._4_4_);
    }
    else {
      (**(code **)(*_length + 0xe8))(_length,input_local,message_local,value_23._4_4_);
    }
    break;
  case TYPE_SFIXED64:
    bVar4 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff00);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x210))(_length,input_local,message_local,iStack_100);
    }
    else {
      (**(code **)(*_length + 0xf0))(_length,input_local,message_local,iStack_100);
    }
    break;
  case TYPE_SINT32:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      ((CodedInputStream *)message_reflection,(int32 *)((long)&value_17 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x208))(_length,input_local,message_local,value_17._4_4_);
    }
    else {
      (**(code **)(*_length + 0xe8))(_length,input_local,message_local,value_17._4_4_);
    }
    break;
  case MAX_TYPE:
    bVar4 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff30);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_005b23af;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      (**(code **)(*_length + 0x210))(_length,input_local,message_local,iStack_d0);
    }
    else {
      (**(code **)(*_length + 0xf0))(_length,input_local,message_local,iStack_d0);
    }
  }
LAB_005b23ab:
  field_local._7_1_ = 1;
LAB_005b23af:
  return (bool)(field_local._7_1_ & 1);
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,        // May be NULL for unknown
    Message* message,
    io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
             WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPPTYPE value;                                                       \
          if (!WireFormatLite::ReadPrimitive<                                  \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))          \
            return false;                                                      \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);      \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PACKED_TYPE( INT32,  int32,  Int32)
      HANDLE_PACKED_TYPE( INT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(SINT32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SINT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE( FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE( FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_PACKED_TYPE(FLOAT , float , Float )
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)
                  ->AddVarint(
                      WireFormatLite::GetTagFieldNumber(tag),
                      sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
      case FieldDescriptor::TYPE_##TYPE: {                                    \
        CPPTYPE value;                                                        \
        if (!WireFormatLite::ReadPrimitive<                                   \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))         \
          return false;                                                       \
        if (field->is_repeated()) {                                           \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);     \
        } else {                                                              \
          message_reflection->Set##CPPTYPE_METHOD(message, field, value);     \
        }                                                                     \
        break;                                                                \
      }

      HANDLE_TYPE( INT32,  int32,  Int32)
      HANDLE_TYPE( INT64,  int64,  Int64)
      HANDLE_TYPE(SINT32,  int32,  Int32)
      HANDLE_TYPE(SINT64,  int64,  Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE( FIXED32, uint32, UInt32)
      HANDLE_TYPE( FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_TYPE(FLOAT , float , Float )
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;
        if (message->GetDescriptor()->file()->syntax() ==
            FileDescriptor::SYNTAX_PROTO3) {
          if (field->is_repeated()) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            message_reflection->SetEnumValue(message, field, value);
          }
        } else {
          const EnumValueDescriptor* enum_value =
              field->enum_type()->FindValueByNumber(value);
          if (enum_value != NULL) {
            if (field->is_repeated()) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              message_reflection->SetEnum(message, field, enum_value);
            }
          } else {
            // The enum value is not one of the known values.  Add it to the
            // UnknownFieldSet.
            int64 sign_extended_value = static_cast<int64>(value);
            message_reflection->MutableUnknownFields(message)
                              ->AddVarint(
                                  WireFormatLite::GetTagFieldNumber(tag),
                                  sign_extended_value);
          }
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(
                  value.data(), value.length(), WireFormatLite::PARSE,
                  field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}